

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjbench.c
# Opt level: O1

int decomp(uchar *srcBuf,uchar **jpegBuf,unsigned_long *jpegSize,uchar *dstBuf,int w,int h,
          int subsamp,int jpegQual,char *fileName,int tilew,int tileh)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uchar uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint extraout_EAX;
  int iVar20;
  tjhandle handle;
  char *pcVar21;
  unsigned_long __size;
  uchar *dstBuf_00;
  int *piVar22;
  int iVar23;
  ulong uVar24;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int len;
  uchar *puVar25;
  char *pcVar26;
  ulong uVar27;
  undefined8 uVar28;
  long lVar29;
  uchar *puVar30;
  uchar uVar31;
  uchar *puVar32;
  long lVar33;
  double dVar34;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar35;
  undefined1 auVar41 [16];
  double dVar36;
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uint local_53c;
  double local_510;
  char sizeStr [24];
  char qualStr [13];
  char tempStr [1024];
  undefined1 auStack_38 [8];
  
  sizeStr[0x10] = '\0';
  sizeStr[0x11] = '\0';
  sizeStr[0x12] = '\0';
  sizeStr[0x13] = '\0';
  sizeStr[0x14] = '\0';
  sizeStr[0x15] = '\0';
  sizeStr[0x16] = '\0';
  sizeStr[0x17] = '\0';
  sizeStr[0] = '\0';
  sizeStr[1] = '\0';
  sizeStr[2] = '\0';
  sizeStr[3] = '\0';
  sizeStr[4] = '\0';
  sizeStr[5] = '\0';
  sizeStr[6] = '\0';
  sizeStr[7] = '\0';
  sizeStr[8] = '\0';
  sizeStr[9] = '\0';
  sizeStr[10] = '\0';
  sizeStr[0xb] = '\0';
  sizeStr[0xc] = '\0';
  sizeStr[0xd] = '\0';
  sizeStr[0xe] = '\0';
  sizeStr[0xf] = '\0';
  qualStr[8] = '\0';
  qualStr[9] = '\0';
  qualStr[10] = '\0';
  qualStr[0xb] = '\0';
  qualStr[0xc] = '\0';
  iVar13 = 0;
  qualStr[0] = '\0';
  qualStr[1] = '\0';
  qualStr[2] = '\0';
  qualStr[3] = '\0';
  qualStr[4] = '\0';
  qualStr[5] = '\0';
  qualStr[6] = '\0';
  qualStr[7] = '\0';
  iVar20 = tjPixelSize[pf];
  iVar8 = (sf.num * w + sf.denom + -1) / sf.denom;
  iVar9 = (sf.denom + sf.num * h + -1) / sf.denom;
  iVar10 = (w + tilew + -1) / tilew;
  iVar11 = (h + tileh + -1) / tileh;
  if (0 < jpegQual) {
    snprintf(qualStr,0xd,"_Q%d");
  }
  qualStr[0xc] = '\0';
  handle = tjInitDecompress();
  if (handle == (tjhandle)0x0) {
    iVar12 = tjGetErrorCode((tjhandle)0x0);
    pcVar21 = tjGetErrorStr2((tjhandle)0x0);
    bVar2 = (flags & 0x2000U) != 0;
    if (bVar2 || iVar12 != 0) {
      pcVar26 = "ERROR";
      if (iVar12 == 0) {
        pcVar26 = "WARNING";
      }
      printf("%s in line %d while %s:\n%s\n",pcVar26,0xa2,"executing tjInitDecompress()",pcVar21);
      iVar13 = -1;
    }
    else {
      iVar13 = strncmp(tjErrorStr,pcVar21,200);
      if ((((iVar13 != 0) ||
           (auVar44[0] = -(tjErrorMsg[0xd] == 'n'), auVar44[1] = -(tjErrorMsg[0xe] == 'i'),
           auVar44[2] = -(tjErrorMsg[0xf] == 't'), auVar44[3] = -(tjErrorMsg[0x10] == 'D'),
           auVar44[4] = -(tjErrorMsg[0x11] == 'e'), auVar44[5] = -(tjErrorMsg[0x12] == 'c'),
           auVar44[6] = -(tjErrorMsg[0x13] == 'o'), auVar44[7] = -(tjErrorMsg[0x14] == 'm'),
           auVar44[8] = -(tjErrorMsg[0x15] == 'p'), auVar44[9] = -(tjErrorMsg[0x16] == 'r'),
           auVar44[10] = -(tjErrorMsg[0x17] == 'e'), auVar44[0xb] = -(tjErrorMsg[0x18] == 's'),
           auVar44[0xc] = -(tjErrorMsg[0x19] == 's'), auVar44[0xd] = -(tjErrorMsg[0x1a] == '('),
           auVar44[0xe] = -(tjErrorMsg[0x1b] == ')'), auVar44[0xf] = -(tjErrorMsg[0x1c] == '\0'),
           auVar37[0] = -(tjErrorMsg[0] == 'e'), auVar37[1] = -(tjErrorMsg[1] == 'x'),
           auVar37[2] = -(tjErrorMsg[2] == 'e'), auVar37[3] = -(tjErrorMsg[3] == 'c'),
           auVar37[4] = -(tjErrorMsg[4] == 'u'), auVar37[5] = -(tjErrorMsg[5] == 't'),
           auVar37[6] = -(tjErrorMsg[6] == 'i'), auVar37[7] = -(tjErrorMsg[7] == 'n'),
           auVar37[8] = -(tjErrorMsg[8] == 'g'), auVar37[9] = -(tjErrorMsg[9] == ' '),
           auVar37[10] = -(tjErrorMsg[10] == 't'), auVar37[0xb] = -(tjErrorMsg[0xb] == 'j'),
           auVar37[0xc] = -(tjErrorMsg[0xc] == 'I'), auVar37[0xd] = -(tjErrorMsg[0xd] == 'n'),
           auVar37[0xe] = -(tjErrorMsg[0xe] == 'i'), auVar37[0xf] = -(tjErrorMsg[0xf] == 't'),
           auVar37 = auVar37 & auVar44,
           (ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) != 0xffff)) || (tjErrorCode != 0)) ||
         (iVar13 = 0, tjErrorLine != 0xa2)) {
        strncpy(tjErrorStr,pcVar21,199);
        strncpy(tjErrorMsg,"executing tjInitDecompress()",199);
        tjErrorCode = 0;
        tjErrorLine = 0xa2;
        iVar13 = 0;
        printf("WARNING in line %d while %s:\n%s\n",0xa2,"executing tjInitDecompress()",pcVar21);
      }
    }
    if (!bVar2 && iVar12 == 0) goto LAB_0010b192;
    dstBuf_00 = (uchar *)0x0;
    bVar2 = false;
LAB_0010b32b:
    handle = (tjhandle)0x0;
  }
  else {
LAB_0010b192:
    iVar12 = iVar8 * iVar20;
    bVar2 = false;
    lVar29 = (long)iVar12;
    if (dstBuf == (uchar *)0x0) {
      dstBuf = (uchar *)malloc(lVar29 * iVar9);
      if (dstBuf == (uchar *)0x0) {
        piVar22 = __errno_location();
        pcVar21 = strerror(*piVar22);
        dstBuf_00 = (uchar *)0x0;
        printf("ERROR in line %d while %s:\n%s\n",0xa9,"allocating destination buffer",pcVar21);
        iVar13 = -1;
        bVar2 = false;
        dstBuf = (uchar *)0x0;
        goto LAB_0010bc8b;
      }
      bVar2 = true;
    }
    memset(dstBuf,0x7f,iVar9 * lVar29);
    if (doYUV == 0) {
      dstBuf_00 = (uchar *)0x0;
    }
    else {
      iVar14 = tileh;
      iVar15 = tilew;
      if (doTile == 0) {
        iVar14 = iVar9;
        iVar15 = iVar8;
      }
      __size = tjBufSizeYUV2(iVar15,yuvPad,iVar14,subsamp);
      if (__size == 0xffffffffffffffff) {
        iVar14 = tjGetErrorCode(handle);
        pcVar21 = tjGetErrorStr2(handle);
        bVar3 = (flags & 0x2000U) != 0;
        if (bVar3 || iVar14 != 0) {
          pcVar26 = "ERROR";
          if (iVar14 == 0) {
            pcVar26 = "WARNING";
          }
          printf("%s in line %d while %s:\n%s\n",pcVar26,0xb6,"allocating YUV buffer",pcVar21);
          iVar13 = -1;
          bVar4 = true;
        }
        else {
          iVar15 = strncmp(tjErrorStr,pcVar21,200);
          if (((iVar15 != 0) ||
              (auVar45[0] = -(tjErrorMsg[6] == 't'), auVar45[1] = -(tjErrorMsg[7] == 'i'),
              auVar45[2] = -(tjErrorMsg[8] == 'n'), auVar45[3] = -(tjErrorMsg[9] == 'g'),
              auVar45[4] = -(tjErrorMsg[10] == ' '), auVar45[5] = -(tjErrorMsg[0xb] == 'Y'),
              auVar45[6] = -(tjErrorMsg[0xc] == 'U'), auVar45[7] = -(tjErrorMsg[0xd] == 'V'),
              auVar45[8] = -(tjErrorMsg[0xe] == ' '), auVar45[9] = -(tjErrorMsg[0xf] == 'b'),
              auVar45[10] = -(tjErrorMsg[0x10] == 'u'), auVar45[0xb] = -(tjErrorMsg[0x11] == 'f'),
              auVar45[0xc] = -(tjErrorMsg[0x12] == 'f'), auVar45[0xd] = -(tjErrorMsg[0x13] == 'e'),
              auVar45[0xe] = -(tjErrorMsg[0x14] == 'r'), auVar45[0xf] = -(tjErrorMsg[0x15] == '\0'),
              auVar38[0] = -(tjErrorMsg[0] == 'a'), auVar38[1] = -(tjErrorMsg[1] == 'l'),
              auVar38[2] = -(tjErrorMsg[2] == 'l'), auVar38[3] = -(tjErrorMsg[3] == 'o'),
              auVar38[4] = -(tjErrorMsg[4] == 'c'), auVar38[5] = -(tjErrorMsg[5] == 'a'),
              auVar38[6] = -(tjErrorMsg[6] == 't'), auVar38[7] = -(tjErrorMsg[7] == 'i'),
              auVar38[8] = -(tjErrorMsg[8] == 'n'), auVar38[9] = -(tjErrorMsg[9] == 'g'),
              auVar38[10] = -(tjErrorMsg[10] == ' '), auVar38[0xb] = -(tjErrorMsg[0xb] == 'Y'),
              auVar38[0xc] = -(tjErrorMsg[0xc] == 'U'), auVar38[0xd] = -(tjErrorMsg[0xd] == 'V'),
              auVar38[0xe] = -(tjErrorMsg[0xe] == ' '), auVar38[0xf] = -(tjErrorMsg[0xf] == 'b'),
              auVar38 = auVar38 & auVar45,
              (ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) != 0xffff)) ||
             ((tjErrorCode != 0 || (bVar4 = false, tjErrorLine != 0xb6)))) {
            strncpy(tjErrorStr,pcVar21,199);
            strncpy(tjErrorMsg,"allocating YUV buffer",199);
            tjErrorCode = 0;
            tjErrorLine = 0xb6;
            bVar4 = false;
            printf("WARNING in line %d while %s:\n%s\n",0xb6,"allocating YUV buffer",pcVar21);
          }
        }
        if (!bVar3 && iVar14 == 0) goto LAB_0010b3c4;
        dstBuf_00 = (uchar *)0x0;
      }
      else {
LAB_0010b3c4:
        dstBuf_00 = (uchar *)malloc(__size);
        if (dstBuf_00 == (uchar *)0x0) {
          piVar22 = __errno_location();
          pcVar21 = strerror(*piVar22);
          dstBuf_00 = (uchar *)0x0;
          printf("ERROR in line %d while %s:\n%s\n",0xb8,"allocating YUV buffer",pcVar21);
          iVar13 = -1;
          bVar4 = true;
        }
        else {
          memset(dstBuf_00,0x7f,__size);
          bVar4 = false;
        }
      }
      if (bVar4) goto LAB_0010bc8b;
      if (bVar4) {
        return iVar13;
      }
    }
    local_53c = 0xffffffff;
    local_510 = 0.0;
    dVar43 = 0.0;
    do {
      dVar34 = getTime();
      if (0 < iVar11) {
        iVar14 = 0;
        iVar15 = 0;
        puVar25 = dstBuf;
        do {
          if (0 < iVar10) {
            iVar23 = h - iVar14 * tileh;
            if (tileh <= iVar23) {
              iVar23 = tileh;
            }
            lVar33 = 0;
            puVar32 = puVar25;
            iVar7 = w;
            do {
              iVar19 = iVar7;
              if (tilew <= iVar7) {
                iVar19 = tilew;
              }
              iVar16 = iVar23;
              if (doTile == 0) {
                iVar16 = iVar9;
                iVar19 = iVar8;
              }
              if (doYUV == 0) {
                uVar18 = tjDecompress2(handle,jpegBuf[iVar15 + lVar33],jpegSize[iVar15 + lVar33],
                                       puVar32,iVar19,iVar12,iVar16,pf,flags);
                if (uVar18 == 0xffffffff) {
                  iVar19 = tjGetErrorCode(handle);
                  pcVar21 = tjGetErrorStr2(handle);
                  bVar3 = (flags & 0x2000U) != 0;
                  if (bVar3 || iVar19 != 0) {
                    pcVar26 = "ERROR";
                    if (iVar19 == 0) {
                      pcVar26 = "WARNING";
                    }
                    printf("%s in line %d while %s:\n%s\n",pcVar26,0xd8,"executing tjDecompress2()",
                           pcVar21);
                    uVar18 = 0xffffffff;
                    iVar13 = -1;
                    iVar16 = 2;
                  }
                  else {
                    iVar16 = strncmp(tjErrorStr,pcVar21,200);
                    if (iVar16 == 0) {
                      auVar40[0] = -(tjErrorMsg[10] == 't');
                      auVar40[1] = -(tjErrorMsg[0xb] == 'j');
                      auVar40[2] = -(tjErrorMsg[0xc] == 'D');
                      auVar40[3] = -(tjErrorMsg[0xd] == 'e');
                      auVar40[4] = -(tjErrorMsg[0xe] == 'c');
                      auVar40[5] = -(tjErrorMsg[0xf] == 'o');
                      auVar40[6] = -(tjErrorMsg[0x10] == 'm');
                      auVar40[7] = -(tjErrorMsg[0x11] == 'p');
                      auVar40[8] = -(tjErrorMsg[0x12] == 'r');
                      auVar40[9] = -(tjErrorMsg[0x13] == 'e');
                      auVar40[10] = -(tjErrorMsg[0x14] == 's');
                      auVar40[0xb] = -(tjErrorMsg[0x15] == 's');
                      auVar40[0xc] = -(tjErrorMsg[0x16] == '2');
                      auVar40[0xd] = -(tjErrorMsg[0x17] == '(');
                      auVar40[0xe] = -(tjErrorMsg[0x18] == ')');
                      auVar40[0xf] = -(tjErrorMsg[0x19] == '\0');
                      auVar47[0] = -(tjErrorMsg[0] == 'e');
                      auVar47[1] = -(tjErrorMsg[1] == 'x');
                      auVar47[2] = -(tjErrorMsg[2] == 'e');
                      auVar47[3] = -(tjErrorMsg[3] == 'c');
                      auVar47[4] = -(tjErrorMsg[4] == 'u');
                      auVar47[5] = -(tjErrorMsg[5] == 't');
                      auVar47[6] = -(tjErrorMsg[6] == 'i');
                      auVar47[7] = -(tjErrorMsg[7] == 'n');
                      auVar47[8] = -(tjErrorMsg[8] == 'g');
                      auVar47[9] = -(tjErrorMsg[9] == ' ');
                      auVar47[10] = -(tjErrorMsg[10] == 't');
                      auVar47[0xb] = -(tjErrorMsg[0xb] == 'j');
                      auVar47[0xc] = -(tjErrorMsg[0xc] == 'D');
                      auVar47[0xd] = -(tjErrorMsg[0xd] == 'e');
                      auVar47[0xe] = -(tjErrorMsg[0xe] == 'c');
                      auVar47[0xf] = -(tjErrorMsg[0xf] == 'o');
                      auVar47 = auVar47 & auVar40;
                      uVar1 = (ushort)(SUB161(auVar47 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar47[0xf] >> 7) << 0xf;
                      uVar18 = (uint)uVar1;
                      if (((uVar1 == 0xffff) && (tjErrorCode == 0)) &&
                         (iVar16 = 0, tjErrorLine == 0xd8)) goto LAB_0010ba3b;
                    }
                    strncpy(tjErrorStr,pcVar21,199);
                    strncpy(tjErrorMsg,"executing tjDecompress2()",199);
                    tjErrorCode = 0;
                    tjErrorLine = 0xd8;
                    iVar16 = 0;
                    uVar18 = printf("WARNING in line %d while %s:\n%s\n",0xd8,
                                    "executing tjDecompress2()",pcVar21);
                  }
LAB_0010ba3b:
                  if (bVar3 || iVar19 != 0) goto LAB_0010b9d3;
                }
LAB_0010b9d1:
                iVar16 = 0;
              }
              else {
                iVar16 = tjDecompressToYUV2(handle,jpegBuf[iVar15 + lVar33],
                                            jpegSize[iVar15 + lVar33],dstBuf_00,iVar19,yuvPad,iVar16
                                            ,flags);
                if (iVar16 == -1) {
                  iVar17 = tjGetErrorCode(handle);
                  pcVar21 = tjGetErrorStr2(handle);
                  bVar3 = (flags & 0x2000U) == 0;
                  if (bVar3 && iVar17 == 0) {
                    iVar16 = strncmp(tjErrorStr,pcVar21,200);
                    if (iVar16 == 0) {
                      auVar39[0] = -(tjErrorMsg[0xf] == 'o');
                      auVar39[1] = -(tjErrorMsg[0x10] == 'm');
                      auVar39[2] = -(tjErrorMsg[0x11] == 'p');
                      auVar39[3] = -(tjErrorMsg[0x12] == 'r');
                      auVar39[4] = -(tjErrorMsg[0x13] == 'e');
                      auVar39[5] = -(tjErrorMsg[0x14] == 's');
                      auVar39[6] = -(tjErrorMsg[0x15] == 's');
                      auVar39[7] = -(tjErrorMsg[0x16] == 'T');
                      auVar39[8] = -(tjErrorMsg[0x17] == 'o');
                      auVar39[9] = -(tjErrorMsg[0x18] == 'Y');
                      auVar39[10] = -(tjErrorMsg[0x19] == 'U');
                      auVar39[0xb] = -(tjErrorMsg[0x1a] == 'V');
                      auVar39[0xc] = -(tjErrorMsg[0x1b] == '2');
                      auVar39[0xd] = -(tjErrorMsg[0x1c] == '(');
                      auVar39[0xe] = -(tjErrorMsg[0x1d] == ')');
                      auVar39[0xf] = -(tjErrorMsg[0x1e] == '\0');
                      auVar46[0] = -(tjErrorMsg[0] == 'e');
                      auVar46[1] = -(tjErrorMsg[1] == 'x');
                      auVar46[2] = -(tjErrorMsg[2] == 'e');
                      auVar46[3] = -(tjErrorMsg[3] == 'c');
                      auVar46[4] = -(tjErrorMsg[4] == 'u');
                      auVar46[5] = -(tjErrorMsg[5] == 't');
                      auVar46[6] = -(tjErrorMsg[6] == 'i');
                      auVar46[7] = -(tjErrorMsg[7] == 'n');
                      auVar46[8] = -(tjErrorMsg[8] == 'g');
                      auVar46[9] = -(tjErrorMsg[9] == ' ');
                      auVar46[10] = -(tjErrorMsg[10] == 't');
                      auVar46[0xb] = -(tjErrorMsg[0xb] == 'j');
                      auVar46[0xc] = -(tjErrorMsg[0xc] == 'D');
                      auVar46[0xd] = -(tjErrorMsg[0xd] == 'e');
                      auVar46[0xe] = -(tjErrorMsg[0xe] == 'c');
                      auVar46[0xf] = -(tjErrorMsg[0xf] == 'o');
                      auVar46 = auVar46 & auVar39;
                      uVar1 = (ushort)(SUB161(auVar46 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar46[0xf] >> 7) << 0xf;
                      uVar18 = (uint)uVar1;
                      if (((uVar1 == 0xffff) && (tjErrorCode == 0)) &&
                         (iVar16 = 0, tjErrorLine == 0xcf)) goto LAB_0010b80a;
                    }
                    strncpy(tjErrorStr,pcVar21,199);
                    strncpy(tjErrorMsg,"executing tjDecompressToYUV2()",199);
                    tjErrorCode = 0;
                    tjErrorLine = 0xcf;
                    iVar16 = 0;
                    uVar18 = printf("WARNING in line %d while %s:\n%s\n",0xcf,
                                    "executing tjDecompressToYUV2()",pcVar21);
                  }
                  else {
                    pcVar26 = "ERROR";
                    if (iVar17 == 0) {
                      pcVar26 = "WARNING";
                    }
                    printf("%s in line %d while %s:\n%s\n",pcVar26,0xcf,
                           "executing tjDecompressToYUV2()",pcVar21);
                    uVar18 = 0xffffffff;
                    iVar13 = -1;
                    iVar16 = 2;
                  }
LAB_0010b80a:
                  if (bVar3 && iVar17 == 0) goto LAB_0010b81a;
                }
                else {
LAB_0010b81a:
                  dVar35 = getTime();
                  uVar18 = tjDecodeYUV(handle,dstBuf_00,yuvPad,subsamp,puVar32,iVar19,iVar12);
                  if (uVar18 == 0xffffffff) {
                    iVar19 = tjGetErrorCode(handle);
                    pcVar21 = tjGetErrorStr2(handle);
                    bVar3 = (flags & 0x2000U) != 0;
                    if (bVar3 || iVar19 != 0) {
                      pcVar26 = "ERROR";
                      if (iVar19 == 0) {
                        pcVar26 = "WARNING";
                      }
                      printf("%s in line %d while %s:\n%s\n",pcVar26,0xd3,"executing tjDecodeYUV()",
                             pcVar21);
                      uVar18 = 0xffffffff;
                      iVar13 = -1;
                      iVar16 = 2;
                    }
                    else {
                      iVar16 = strncmp(tjErrorStr,pcVar21,200);
                      if (iVar16 == 0) {
                        auVar41[0] = -(tjErrorMsg[0x10] == 'd');
                        auVar41[1] = -(tjErrorMsg[0x11] == 'e');
                        auVar41[2] = -(tjErrorMsg[0x12] == 'Y');
                        auVar41[3] = -(tjErrorMsg[0x13] == 'U');
                        auVar41[4] = -(tjErrorMsg[0x14] == 'V');
                        auVar41[5] = -(tjErrorMsg[0x15] == '(');
                        auVar41[6] = -(tjErrorMsg[0x16] == ')');
                        auVar41[7] = -(tjErrorMsg[0x17] == '\0');
                        auVar41[8] = 0xff;
                        auVar41[9] = 0xff;
                        auVar41[10] = 0xff;
                        auVar41[0xb] = 0xff;
                        auVar41[0xc] = 0xff;
                        auVar41[0xd] = 0xff;
                        auVar41[0xe] = 0xff;
                        auVar41[0xf] = 0xff;
                        auVar48[0] = -(tjErrorMsg[0] == 'e');
                        auVar48[1] = -(tjErrorMsg[1] == 'x');
                        auVar48[2] = -(tjErrorMsg[2] == 'e');
                        auVar48[3] = -(tjErrorMsg[3] == 'c');
                        auVar48[4] = -(tjErrorMsg[4] == 'u');
                        auVar48[5] = -(tjErrorMsg[5] == 't');
                        auVar48[6] = -(tjErrorMsg[6] == 'i');
                        auVar48[7] = -(tjErrorMsg[7] == 'n');
                        auVar48[8] = -(tjErrorMsg[8] == 'g');
                        auVar48[9] = -(tjErrorMsg[9] == ' ');
                        auVar48[10] = -(tjErrorMsg[10] == 't');
                        auVar48[0xb] = -(tjErrorMsg[0xb] == 'j');
                        auVar48[0xc] = -(tjErrorMsg[0xc] == 'D');
                        auVar48[0xd] = -(tjErrorMsg[0xd] == 'e');
                        auVar48[0xe] = -(tjErrorMsg[0xe] == 'c');
                        auVar48[0xf] = -(tjErrorMsg[0xf] == 'o');
                        auVar48 = auVar48 & auVar41;
                        uVar1 = (ushort)(SUB161(auVar48 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar48[0xf] >> 7) << 0xf;
                        uVar18 = (uint)uVar1;
                        if (((uVar1 == 0xffff) && (tjErrorCode == 0)) &&
                           (iVar16 = 0, tjErrorLine == 0xd3)) goto LAB_0010b995;
                      }
                      strncpy(tjErrorStr,pcVar21,199);
                      strncpy(tjErrorMsg,"executing tjDecodeYUV()",199);
                      tjErrorCode = 0;
                      tjErrorLine = 0xd3;
                      iVar16 = 0;
                      uVar18 = printf("WARNING in line %d while %s:\n%s\n",0xd3,
                                      "executing tjDecodeYUV()",pcVar21);
                    }
LAB_0010b995:
                    if (bVar3 || iVar19 != 0) goto LAB_0010b9cd;
                  }
                  iVar16 = 0;
                  if (-1 < (int)local_53c) {
                    dVar36 = getTime();
                    local_510 = local_510 + (dVar36 - dVar35);
                    uVar18 = extraout_EAX;
                  }
                }
LAB_0010b9cd:
                if (iVar16 == 0) goto LAB_0010b9d1;
              }
LAB_0010b9d3:
              if (iVar16 != 0) goto LAB_0010bb43;
              puVar32 = puVar32 + iVar20 * tilew;
              lVar33 = lVar33 + 1;
              iVar7 = iVar7 - tilew;
            } while (iVar10 != (int)lVar33);
            iVar15 = iVar15 + (int)lVar33;
          }
          iVar14 = iVar14 + 1;
          puVar25 = puVar25 + tileh * lVar29;
        } while (iVar14 != iVar11);
      }
      dVar35 = getTime();
      dVar43 = dVar43 + (dVar35 - dVar34);
      if ((int)local_53c < 0) {
        iVar16 = 0;
        uVar18 = local_53c;
        if (warmup <= dVar43) {
          dVar43 = 0.0;
          local_510 = 0.0;
          iVar16 = 0;
          local_53c = 0;
        }
      }
      else {
        local_53c = local_53c + 1;
        iVar16 = 4;
        uVar18 = local_53c;
        if (dVar43 < benchTime) {
          iVar16 = 0;
        }
      }
LAB_0010bb43:
    } while (iVar16 == 0);
    if (iVar16 == 2) goto LAB_0010bc8b;
    if (iVar16 != 4) {
      return uVar18;
    }
    if (doYUV != 0) {
      dVar43 = dVar43 - local_510;
    }
    iVar11 = tjDestroy(handle);
    iVar10 = extraout_EDX;
    if (iVar11 == -1) {
      iVar11 = tjGetErrorCode(handle);
      pcVar21 = tjGetErrorStr2(handle);
      bVar3 = (flags & 0x2000U) != 0;
      if (bVar3 || iVar11 != 0) {
        pcVar26 = "ERROR";
        if (iVar11 == 0) {
          pcVar26 = "WARNING";
        }
        printf("%s in line %d while %s:\n%s\n",pcVar26,0xe6,"executing tjDestroy()",pcVar21);
        iVar13 = -1;
        iVar10 = extraout_EDX_02;
      }
      else {
        iVar10 = strncmp(tjErrorStr,pcVar21,200);
        if (((iVar10 != 0) ||
            (auVar49[0] = -(tjErrorMsg[6] == 'i'), auVar49[1] = -(tjErrorMsg[7] == 'n'),
            auVar49[2] = -(tjErrorMsg[8] == 'g'), auVar49[3] = -(tjErrorMsg[9] == ' '),
            auVar49[4] = -(tjErrorMsg[10] == 't'), auVar49[5] = -(tjErrorMsg[0xb] == 'j'),
            auVar49[6] = -(tjErrorMsg[0xc] == 'D'), auVar49[7] = -(tjErrorMsg[0xd] == 'e'),
            auVar49[8] = -(tjErrorMsg[0xe] == 's'), auVar49[9] = -(tjErrorMsg[0xf] == 't'),
            auVar49[10] = -(tjErrorMsg[0x10] == 'r'), auVar49[0xb] = -(tjErrorMsg[0x11] == 'o'),
            auVar49[0xc] = -(tjErrorMsg[0x12] == 'y'), auVar49[0xd] = -(tjErrorMsg[0x13] == '('),
            auVar49[0xe] = -(tjErrorMsg[0x14] == ')'), auVar49[0xf] = -(tjErrorMsg[0x15] == '\0'),
            auVar42[0] = -(tjErrorMsg[0] == 'e'), auVar42[1] = -(tjErrorMsg[1] == 'x'),
            auVar42[2] = -(tjErrorMsg[2] == 'e'), auVar42[3] = -(tjErrorMsg[3] == 'c'),
            auVar42[4] = -(tjErrorMsg[4] == 'u'), auVar42[5] = -(tjErrorMsg[5] == 't'),
            auVar42[6] = -(tjErrorMsg[6] == 'i'), auVar42[7] = -(tjErrorMsg[7] == 'n'),
            auVar42[8] = -(tjErrorMsg[8] == 'g'), auVar42[9] = -(tjErrorMsg[9] == ' '),
            auVar42[10] = -(tjErrorMsg[10] == 't'), auVar42[0xb] = -(tjErrorMsg[0xb] == 'j'),
            auVar42[0xc] = -(tjErrorMsg[0xc] == 'D'), auVar42[0xd] = -(tjErrorMsg[0xd] == 'e'),
            auVar42[0xe] = -(tjErrorMsg[0xe] == 's'), auVar42[0xf] = -(tjErrorMsg[0xf] == 't'),
            auVar42 = auVar42 & auVar49,
            (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff)) ||
           ((tjErrorCode != 0 || (iVar10 = extraout_EDX_00, tjErrorLine != 0xe6)))) {
          strncpy(tjErrorStr,pcVar21,199);
          strncpy(tjErrorMsg,"executing tjDestroy()",199);
          tjErrorCode = 0;
          tjErrorLine = 0xe6;
          printf("WARNING in line %d while %s:\n%s\n",0xe6,"executing tjDestroy()",pcVar21);
          iVar10 = extraout_EDX_01;
        }
      }
      if (bVar3 || iVar11 != 0) goto LAB_0010bc8b;
    }
    dVar34 = (double)(int)local_53c;
    if (quiet == 0) {
      pcVar21 = "Decomp to YUV";
      if (doYUV == 0) {
        pcVar21 = "Decompress   ";
      }
      printf("%s --> Frame rate:         %f fps\n",dVar34 / dVar43,pcVar21);
      dVar35 = ((double)(h * w) / 1000000.0) * dVar34;
      printf("                  Throughput:         %f Megapixels/sec\n",dVar35 / dVar43);
      if (doYUV != 0) {
        printf("YUV Decode    --> Frame rate:         %f fps\n",dVar34 / local_510);
        printf("                  Throughput:         %f Megapixels/sec\n",dVar35 / local_510);
      }
    }
    else {
      dVar34 = ((double)(h * w) / 1000000.0) * dVar34;
      sigfig(dVar34 / dVar43,(int)tempStr,&c_derived_tbl_ehufsi,iVar10);
      pcVar21 = "  ";
      if (quiet == 2) {
        pcVar21 = "\n";
      }
      printf("%-6s%s",tempStr,pcVar21);
      if (doYUV == 0) {
        if (quiet != 2) {
          putchar(10);
        }
      }
      else {
        sigfig(dVar34 / local_510,(int)tempStr,&c_derived_tbl_ehufsi,len);
        puts(tempStr);
      }
    }
    if (doWrite == 0) goto LAB_0010b32b;
    if (sf.denom == 1 && sf.num == 1) {
      if (tileh != h || tilew != w) {
        pcVar21 = "%dx%d";
        goto LAB_0010bf41;
      }
      auVar6._11_5_ = 0;
      auVar6[0] = sizeStr[5];
      auVar6[1] = sizeStr[6];
      auVar6[2] = sizeStr[7];
      auVar6[3] = sizeStr[8];
      auVar6[4] = sizeStr[9];
      auVar6[5] = sizeStr[10];
      auVar6[6] = sizeStr[0xb];
      auVar6[7] = sizeStr[0xc];
      auVar6[8] = sizeStr[0xd];
      auVar6[9] = sizeStr[0xe];
      auVar6[10] = sizeStr[0xf];
      sizeStr._0_16_ = auVar6 << 0x28;
      builtin_strncpy(sizeStr,"full",4);
    }
    else {
      pcVar21 = "%d_%d";
      tilew = sf.num;
      tileh = sf.denom;
LAB_0010bf41:
      snprintf(sizeStr,0x18,pcVar21,(ulong)(uint)tilew,(ulong)(uint)tileh);
    }
    if (decompOnly == 0) {
      snprintf(tempStr,0x400,"%s_%s%s_%s.%s",fileName,subName[subsamp],qualStr,sizeStr,ext);
    }
    else {
      snprintf(tempStr,0x400,"%s_%s.%s",fileName,sizeStr,ext);
    }
    iVar8 = tjSaveImage(tempStr,dstBuf,iVar8,0,iVar9,pf,flags);
    if (iVar8 == -1) {
      pcVar21 = tjGetErrorStr2((tjhandle)0x0);
      uVar28 = 0x10e;
    }
    else {
      pcVar21 = strrchr(tempStr,0x2e);
      snprintf(pcVar21,(size_t)(auStack_38 + -(long)pcVar21),"-err.%s");
      if (srcBuf == (uchar *)0x0) goto LAB_0010b32b;
      handle = (tjhandle)0x0;
      if ((sf.num != 1) || (sf.denom != 1)) goto LAB_0010bc8b;
      if (quiet == 0) {
        printf("Compression error written to %s.\n");
      }
      if (subsamp == 3) {
        if (0 < h) {
          iVar8 = 0;
          puVar25 = dstBuf;
          do {
            puVar32 = puVar25;
            puVar30 = srcBuf;
            iVar9 = w;
            if (0 < w) {
              do {
                lVar33 = (long)pf;
                iVar10 = tjRedOffset[lVar33];
                iVar11 = tjGreenOffset[lVar33];
                iVar12 = tjBlueOffset[lVar33];
                iVar14 = (int)((double)puVar30[iVar12] * 0.114 +
                               (double)puVar30[iVar10] * 0.299 + (double)puVar30[iVar11] * 0.587 +
                              0.5);
                if (0xfe < iVar14) {
                  iVar14 = 0xff;
                }
                if (iVar14 < 1) {
                  iVar14 = 0;
                }
                uVar5 = (uchar)((uint)puVar32[iVar10] - iVar14);
                uVar31 = -uVar5;
                if (0 < (int)((uint)puVar32[iVar10] - iVar14)) {
                  uVar31 = uVar5;
                }
                puVar32[iVar10] = uVar31;
                uVar5 = (uchar)((uint)puVar32[iVar11] - iVar14);
                uVar31 = -uVar5;
                if (0 < (int)((uint)puVar32[iVar11] - iVar14)) {
                  uVar31 = uVar5;
                }
                puVar32[iVar11] = uVar31;
                uVar5 = (uchar)((uint)puVar32[iVar12] - iVar14);
                uVar31 = -uVar5;
                if (0 < (int)((uint)puVar32[iVar12] - iVar14)) {
                  uVar31 = uVar5;
                }
                puVar32[iVar12] = uVar31;
                iVar9 = iVar9 + -1;
                puVar32 = puVar32 + iVar20;
                puVar30 = puVar30 + iVar20;
              } while (iVar9 != 0);
            }
            iVar8 = iVar8 + 1;
            srcBuf = srcBuf + lVar29;
            puVar25 = puVar25 + lVar29;
          } while (iVar8 != h);
        }
      }
      else if (0 < h) {
        uVar24 = 0;
        puVar25 = dstBuf;
        do {
          if (0 < iVar20 * w) {
            uVar27 = 0;
            do {
              uVar5 = (uchar)((uint)puVar25[uVar27] - (uint)srcBuf[uVar27]);
              uVar31 = -uVar5;
              if (0 < (int)((uint)puVar25[uVar27] - (uint)srcBuf[uVar27])) {
                uVar31 = uVar5;
              }
              puVar25[uVar27] = uVar31;
              uVar27 = uVar27 + 1;
            } while ((uint)(iVar20 * w) != uVar27);
          }
          uVar24 = uVar24 + 1;
          puVar25 = puVar25 + lVar29;
          srcBuf = srcBuf + lVar29;
        } while (uVar24 != (uint)h);
      }
      handle = (tjhandle)0x0;
      iVar20 = tjSaveImage(tempStr,dstBuf,w,0,h,pf,flags);
      if (iVar20 != -1) goto LAB_0010bc8b;
      pcVar21 = tjGetErrorStr2((tjhandle)0x0);
      uVar28 = 0x12d;
    }
    handle = (tjhandle)0x0;
    printf("ERROR in line %d while %s:\n%s\n",uVar28,"saving bitmap",pcVar21);
    iVar13 = -1;
  }
LAB_0010bc8b:
  if (handle != (tjhandle)0x0) {
    tjDestroy(handle);
  }
  if (bVar2) {
    free(dstBuf);
  }
  free(dstBuf_00);
  return iVar13;
}

Assistant:

static int decomp(unsigned char *srcBuf, unsigned char **jpegBuf,
                  unsigned long *jpegSize, unsigned char *dstBuf, int w, int h,
                  int subsamp, int jpegQual, char *fileName, int tilew,
                  int tileh)
{
  char tempStr[1024], sizeStr[24] = "\0", qualStr[13] = "\0", *ptr;
  FILE *file = NULL;
  tjhandle handle = NULL;
  int row, col, iter = 0, dstBufAlloc = 0, retval = 0;
  double elapsed, elapsedDecode;
  int ps = tjPixelSize[pf];
  int scaledw = TJSCALED(w, sf);
  int scaledh = TJSCALED(h, sf);
  int pitch = scaledw * ps;
  int ntilesw = (w + tilew - 1) / tilew, ntilesh = (h + tileh - 1) / tileh;
  unsigned char *dstPtr, *dstPtr2, *yuvBuf = NULL;

  if (jpegQual > 0) {
    snprintf(qualStr, 13, "_Q%d", jpegQual);
    qualStr[12] = 0;
  }

  if ((handle = tjInitDecompress()) == NULL)
    THROW_TJ("executing tjInitDecompress()");

  if (dstBuf == NULL) {
    if ((unsigned long long)pitch * (unsigned long long)scaledh >
        (unsigned long long)((size_t)-1))
      THROW("allocating destination buffer", "Image is too large");
    if ((dstBuf = (unsigned char *)malloc((size_t)pitch * scaledh)) == NULL)
      THROW_UNIX("allocating destination buffer");
    dstBufAlloc = 1;
  }
  /* Set the destination buffer to gray so we know whether the decompressor
     attempted to write to it */
  memset(dstBuf, 127, (size_t)pitch * scaledh);

  if (doYUV) {
    int width = doTile ? tilew : scaledw;
    int height = doTile ? tileh : scaledh;
    unsigned long yuvSize = tjBufSizeYUV2(width, yuvPad, height, subsamp);

    if (yuvSize == (unsigned long)-1)
      THROW_TJ("allocating YUV buffer");
    if ((yuvBuf = (unsigned char *)malloc(yuvSize)) == NULL)
      THROW_UNIX("allocating YUV buffer");
    memset(yuvBuf, 127, yuvSize);
  }

  /* Benchmark */
  iter = -1;
  elapsed = elapsedDecode = 0.;
  while (1) {
    int tile = 0;
    double start = getTime();

    for (row = 0, dstPtr = dstBuf; row < ntilesh;
         row++, dstPtr += (size_t)pitch * tileh) {
      for (col = 0, dstPtr2 = dstPtr; col < ntilesw;
           col++, tile++, dstPtr2 += ps * tilew) {
        int width = doTile ? min(tilew, w - col * tilew) : scaledw;
        int height = doTile ? min(tileh, h - row * tileh) : scaledh;

        if (doYUV) {
          double startDecode;

          if (tjDecompressToYUV2(handle, jpegBuf[tile], jpegSize[tile], yuvBuf,
                                 width, yuvPad, height, flags) == -1)
            THROW_TJ("executing tjDecompressToYUV2()");
          startDecode = getTime();
          if (tjDecodeYUV(handle, yuvBuf, yuvPad, subsamp, dstPtr2, width,
                          pitch, height, pf, flags) == -1)
            THROW_TJ("executing tjDecodeYUV()");
          if (iter >= 0) elapsedDecode += getTime() - startDecode;
        } else if (tjDecompress2(handle, jpegBuf[tile], jpegSize[tile],
                                 dstPtr2, width, pitch, height, pf,
                                 flags) == -1)
          THROW_TJ("executing tjDecompress2()");
      }
    }
    elapsed += getTime() - start;
    if (iter >= 0) {
      iter++;
      if (elapsed >= benchTime) break;
    } else if (elapsed >= warmup) {
      iter = 0;
      elapsed = elapsedDecode = 0.;
    }
  }
  if (doYUV) elapsed -= elapsedDecode;

  if (tjDestroy(handle) == -1) THROW_TJ("executing tjDestroy()");
  handle = NULL;

  if (quiet) {
    printf("%-6s%s",
           sigfig((double)(w * h) / 1000000. * (double)iter / elapsed, 4,
                  tempStr, 1024),
           quiet == 2 ? "\n" : "  ");
    if (doYUV)
      printf("%s\n",
             sigfig((double)(w * h) / 1000000. * (double)iter / elapsedDecode,
                    4, tempStr, 1024));
    else if (quiet != 2) printf("\n");
  } else {
    printf("%s --> Frame rate:         %f fps\n",
           doYUV ? "Decomp to YUV" : "Decompress   ", (double)iter / elapsed);
    printf("                  Throughput:         %f Megapixels/sec\n",
           (double)(w * h) / 1000000. * (double)iter / elapsed);
    if (doYUV) {
      printf("YUV Decode    --> Frame rate:         %f fps\n",
             (double)iter / elapsedDecode);
      printf("                  Throughput:         %f Megapixels/sec\n",
             (double)(w * h) / 1000000. * (double)iter / elapsedDecode);
    }
  }

  if (!doWrite) goto bailout;

  if (sf.num != 1 || sf.denom != 1)
    snprintf(sizeStr, 24, "%d_%d", sf.num, sf.denom);
  else if (tilew != w || tileh != h)
    snprintf(sizeStr, 24, "%dx%d", tilew, tileh);
  else snprintf(sizeStr, 24, "full");
  if (decompOnly)
    snprintf(tempStr, 1024, "%s_%s.%s", fileName, sizeStr, ext);
  else
    snprintf(tempStr, 1024, "%s_%s%s_%s.%s", fileName, subName[subsamp],
             qualStr, sizeStr, ext);

  if (tjSaveImage(tempStr, dstBuf, scaledw, 0, scaledh, pf, flags) == -1)
    THROW_TJG("saving bitmap");
  ptr = strrchr(tempStr, '.');
  snprintf(ptr, 1024 - (ptr - tempStr), "-err.%s", ext);
  if (srcBuf && sf.num == 1 && sf.denom == 1) {
    if (!quiet) printf("Compression error written to %s.\n", tempStr);
    if (subsamp == TJ_GRAYSCALE) {
      unsigned long index, index2;

      for (row = 0, index = 0; row < h; row++, index += pitch) {
        for (col = 0, index2 = index; col < w; col++, index2 += ps) {
          unsigned long rindex = index2 + tjRedOffset[pf];
          unsigned long gindex = index2 + tjGreenOffset[pf];
          unsigned long bindex = index2 + tjBlueOffset[pf];
          int y = (int)((double)srcBuf[rindex] * 0.299 +
                        (double)srcBuf[gindex] * 0.587 +
                        (double)srcBuf[bindex] * 0.114 + 0.5);

          if (y > 255) y = 255;
          if (y < 0) y = 0;
          dstBuf[rindex] = abs(dstBuf[rindex] - y);
          dstBuf[gindex] = abs(dstBuf[gindex] - y);
          dstBuf[bindex] = abs(dstBuf[bindex] - y);
        }
      }
    } else {
      for (row = 0; row < h; row++)
        for (col = 0; col < w * ps; col++)
          dstBuf[pitch * row + col] =
            abs(dstBuf[pitch * row + col] - srcBuf[pitch * row + col]);
    }
    if (tjSaveImage(tempStr, dstBuf, w, 0, h, pf, flags) == -1)
      THROW_TJG("saving bitmap");
  }

bailout:
  if (file) fclose(file);
  if (handle) tjDestroy(handle);
  if (dstBufAlloc) free(dstBuf);
  free(yuvBuf);
  return retval;
}